

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void QDirPrivate::sortFileList
               (SortFlags sort,QFileInfoList *l,QStringList *names,QFileInfoList *infos)

{
  undefined8 __first;
  long lVar1;
  long lVar2;
  QFileInfo *pQVar3;
  long in_FS_OFFSET;
  bool bVar4;
  _Iter_comp_iter<QDirSortItemComparator> __comp;
  QCollator coll;
  QDirSortItemComparator local_e68;
  SortFlags sort_local;
  undefined1 local_e50 [3608];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (l->d).size;
  sort_local.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i =
       sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i;
  if (lVar1 != 0) {
    if ((lVar1 == 1) ||
       ((~(uint)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                super_QFlagsStorage<QDir::SortFlag>.i & 3) == 0)) {
      if (infos != (QFileInfoList *)0x0) {
        QArrayDataPointer<QFileInfo>::operator=(&infos->d,&l->d);
      }
      if (names != (QStringList *)0x0) {
        pQVar3 = (l->d).ptr;
        for (lVar1 = (l->d).size << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
          QFileInfo::fileName((QString *)local_e50,pQVar3);
          QList<QString>::emplaceBack<QString>(names,(QString *)local_e50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e50);
          pQVar3 = pQVar3 + 1;
        }
      }
    }
    else {
      memset((QDirSortItem *)(local_e50 + 0x18),0xaa,0xe00);
      local_e50._0_8_ = (Data *)0x40;
      local_e50._8_8_ = (char16_t *)0x0;
      local_e50._16_8_ = (QDirSortItem *)(local_e50 + 0x18);
      QVarLengthArray<QDirSortItem,_64LL>::reserve
                ((QVarLengthArray<QDirSortItem,_64LL> *)local_e50,lVar1);
      for (lVar2 = 0; lVar1 * 8 - lVar2 != 0; lVar2 = lVar2 + 8) {
        QVarLengthArray<QDirSortItem,64ll>::emplace_back<QFileInfo_const&,QFlags<QDir::SortFlag>&>
                  ((QVarLengthArray<QDirSortItem,64ll> *)local_e50,
                   (QFileInfo *)((long)&(((l->d).ptr)->d_ptr).d.ptr + lVar2),&sort_local);
      }
      if (((uint)sort_local.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                 super_QFlagsStorage<QDir::SortFlag>.i & 0x40) == 0) {
        std::__sort<QDirSortItem*,__gnu_cxx::__ops::_Iter_comp_iter<QDirSortItemComparator>>
                  ((QDirSortItem *)local_e50._16_8_,
                   (QDirSortItem *)(local_e50._16_8_ + lVar1 * 0x38),
                   (_Iter_comp_iter<QDirSortItemComparator>)
                   ZEXT416((uint)sort_local.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                                 super_QFlagsStorage<QDir::SortFlag>.i));
      }
      else {
        coll.d = (QCollatorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QCollator::QCollator(&coll);
        __first = local_e50._16_8_;
        QDirSortItemComparator::QDirSortItemComparator(&local_e68,sort_local,&coll);
        __comp._M_comp._4_4_ = 0;
        __comp._M_comp.qt_cmp_si_sort_flags.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
        super_QFlagsStorage<QDir::SortFlag>.i =
             local_e68.qt_cmp_si_sort_flags.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
             super_QFlagsStorage<QDir::SortFlag>.i;
        __comp._M_comp.collator = local_e68.collator;
        std::__sort<QDirSortItem*,__gnu_cxx::__ops::_Iter_comp_iter<QDirSortItemComparator>>
                  ((QDirSortItem *)__first,(QDirSortItem *)(__first + lVar1 * 0x38),__comp);
        QCollator::~QCollator(&coll);
      }
      lVar2 = 0x30;
      while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
        pQVar3 = (QFileInfo *)((long)&(((QString *)local_e50._16_8_)->d).d + lVar2);
        if (infos != (QFileInfoList *)0x0) {
          QList<QFileInfo>::emplaceBack<QFileInfo_const&>(infos,pQVar3);
        }
        if (names != (QStringList *)0x0) {
          if (*(long *)(local_e50._16_8_ + lVar2 + -0x28) == 0) {
            QFileInfo::fileName((QString *)&coll,pQVar3);
          }
          else {
            coll.d = *(QCollatorPrivate **)(local_e50._16_8_ + lVar2 + -0x30);
            if (coll.d != (QCollatorPrivate *)0x0) {
              LOCK();
              ((coll.d)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i =
                   ((coll.d)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                   .super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
          }
          QList<QString>::emplaceBack<QString>(names,(QString *)&coll);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&coll);
        }
        lVar2 = lVar2 + 0x38;
      }
      QVarLengthArray<QDirSortItem,_64LL>::~QVarLengthArray
                ((QVarLengthArray<QDirSortItem,_64LL> *)local_e50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QDirPrivate::sortFileList(QDir::SortFlags sort, const QFileInfoList &l,
                                      QStringList *names, QFileInfoList *infos)
{
    Q_ASSERT(names || infos);
    Q_ASSERT(!infos || infos->isEmpty());
    Q_ASSERT(!names || names->isEmpty());

    const qsizetype n = l.size();
    if (n == 0)
        return;

    if (n == 1 || (sort & QDir::SortByMask) == QDir::Unsorted) {
        if (infos)
            *infos = l;

        if (names) {
            for (const QFileInfo &fi : l)
                names->append(fi.fileName());
        }
    } else {
        QVarLengthArray<QDirSortItem, 64> si;
        si.reserve(n);
        for (qsizetype i = 0; i < n; ++i)
            si.emplace_back(l.at(i), sort);

#ifndef QT_BOOTSTRAPPED
    if (sort.testAnyFlag(QDir::LocaleAware)) {
            QCollator coll;
            std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort, &coll));
        } else {
            std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort));
        }
#else
        std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort));
#endif // QT_BOOTSTRAPPED

        // put them back in the list(s)
        for (qsizetype i = 0; i < n; ++i) {
            auto &fileInfo = si[i].item;
            if (infos)
                infos->append(fileInfo);
            if (names) {
                const bool cached = !si[i].filename_cache.isNull();
                names->append(cached ? si[i].filename_cache : fileInfo.fileName());
            }
        }
    }
}